

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::BuildMessage
          (DescriptorBuilder *this,DescriptorProto *proto,Descriptor *parent,Descriptor *result,
          FlatAllocator *alloc)

{
  flat_hash_map<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
  *this_00;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_01;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  ushort uVar1;
  uint uVar2;
  PointerT<char> pcVar3;
  ushort *puVar4;
  anon_union_8_1_a8a14541_for_iterator_2 args;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_03;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_04;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_05;
  DescriptorBuilder *this_03;
  bool bVar5;
  undefined8 *puVar6;
  DescriptorNames DVar7;
  pointer prVar8;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar9;
  Nullable<const_char_*> failure_msg;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>_>
  *proto_00;
  FieldDescriptor *pFVar10;
  EnumDescriptor *pEVar11;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *proto_01;
  ExtensionRange *pEVar12;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>_>
  *pVVar13;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>_>
  *pVVar14;
  Descriptor *pDVar15;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar16;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *in;
  string *psVar17;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>_>
  *pVVar18;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>_>
  *descriptor;
  void **ppvVar19;
  const_iterator cVar20;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>_>
  pMVar21;
  ReservedRange *pRVar22;
  uint uVar23;
  char *pcVar25;
  long lVar26;
  ulong uVar27;
  int i_6;
  int iVar29;
  ulong uVar28;
  DescriptorProto *pDVar30;
  int i;
  long lVar31;
  int index;
  int i_1;
  int iVar32;
  string_view scope;
  string_view name;
  string_view element_name;
  string_view full_name;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  string_view element_name_03;
  string_view element_name_04;
  string_view element_name_05;
  string_view element_name_06;
  string_view proto_name;
  string_view full_name_00;
  string_view option_name;
  string_view name_00;
  Descriptor *result_local;
  DescriptorBuilder *local_130;
  FieldDescriptor *field;
  DescriptorProto *local_120;
  RepeatedPtrFieldBase *local_118;
  anon_union_8_1_a8a14541_for_iterator_2 local_110;
  anon_union_8_1_a8a14541_for_iterator_2 local_108;
  char local_100;
  RepeatedPtrFieldBase *local_f8;
  ExtensionRange *range;
  int local_e4;
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  reserved_name_set;
  iterator it;
  int iVar24;
  
  if (parent == (Descriptor *)0x0) {
    psVar17 = this->file_->package_;
    pcVar25 = (psVar17->_M_dataplus)._M_p;
    uVar28 = psVar17->_M_string_length;
  }
  else {
    pcVar25 = (parent->all_names_).payload_;
    uVar28 = (ulong)*(ushort *)(pcVar25 + 2);
    pcVar25 = pcVar25 + ~uVar28;
  }
  puVar6 = (undefined8 *)
           ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  scope._M_str = pcVar25;
  scope._M_len = uVar28;
  proto_name._M_str = (char *)*puVar6;
  proto_name._M_len = puVar6[1];
  result_local = result;
  local_120 = proto;
  DVar7 = AllocateNameStrings(this,scope,proto_name,&proto->super_Message,alloc);
  (result->all_names_).payload_ = DVar7.payload_;
  puVar6 = (undefined8 *)
           ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  full_name_00._M_len = (ulong)*(ushort *)(DVar7.payload_ + 2);
  full_name_00._M_str = (FlatAllocator *)(DVar7.payload_ + ~full_name_00._M_len);
  name._M_str = (char *)*puVar6;
  name._M_len = puVar6[1];
  ValidateSymbolName(this,name,full_name_00,&proto->super_Message);
  result->file_ = this->file_;
  result->containing_type_ = parent;
  uVar1 = *(ushort *)&result->field_0x1;
  *(ushort *)&result->field_0x1 = uVar1 & 0xff80;
  result->options_ = (MessageOptions *)0x0;
  *(ushort *)&result->field_0x1 =
       uVar1 & 0xfc80 | (ushort)(((proto->field_0)._impl_.visibility_ & 3U) << 8);
  pcVar25 = (result->all_names_).payload_;
  reserved_name_set.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       (size_t)*(ushort *)(pcVar25 + 2);
  reserved_name_set.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ =
       (size_t)(pcVar25 +
               ~reserved_name_set.
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.capacity_);
  it = absl::lts_20250127::container_internal::
       raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
       ::find<std::basic_string_view<char,std::char_traits<char>>>
                 ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
                   *)&((this->pool_->tables_)._M_t.
                       super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                       .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                      _M_head_impl)->well_known_types_,
                  (key_arg<std::basic_string_view<char>_> *)&reserved_name_set);
  local_130 = this;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
              *)&((this->pool_->tables_)._M_t.
                  super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                 _M_head_impl)->well_known_types_);
  reserved_name_set.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  bVar5 = absl::lts_20250127::container_internal::operator!=(&it,(iterator *)&reserved_name_set);
  if (bVar5) {
    prVar8 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
             ::iterator::operator->(&it);
    *(ushort *)&result_local->field_0x1 =
         (*(ushort *)&result_local->field_0x1 & 0xff83) + ((ushort)prVar8->second & 0x1f) * 4;
  }
  pDVar30 = local_120;
  result_local->sequential_field_limit_ = 0;
  this_01 = &(local_120->field_0)._impl_.field_;
  uVar23 = 0;
  while ((uVar23 < 0xffff && ((int)uVar23 < *(int *)((long)&pDVar30->field_0 + 0x10)))) {
    pVVar9 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                       (&this_01->super_RepeatedPtrFieldBase,uVar23);
    uVar2 = (pVVar9->field_0)._impl_.number_;
    if (uVar2 != uVar23 + 1) break;
    result_local->sequential_field_limit_ = (uint16_t)uVar2;
    uVar23 = uVar2;
  }
  iVar29 = *(int *)((long)&pDVar30->field_0 + 0x88);
  result_local->oneof_decl_count_ = iVar29;
  pcVar3 = (alloc->
           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ).pointers_.payload_.super_Base<char>.value;
  if (pcVar3 == (PointerT<char>)0x0) {
LAB_001396b5:
    failure_msg = "has_allocated()";
    iVar29 = 0x1b0;
  }
  else {
    iVar24 = (alloc->
             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ).used_.payload_.super_Base<char>.value;
    iVar29 = iVar29 * 0x38 + iVar24;
    (alloc->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).used_.payload_.super_Base<char>.value = iVar29;
    failure_msg = absl::lts_20250127::log_internal::Check_LEImpl
                            (iVar29,(alloc->
                                    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                                    ).total_.payload_.super_Base<char>.value,
                             "used <= total_.template Get<TypeToUse>()");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      result_local->oneof_decls_ = (OneofDescriptor *)(pcVar3 + iVar24);
      lVar26 = 0;
      for (lVar31 = 0; lVar31 < *(int *)((long)&pDVar30->field_0 + 0x88); lVar31 = lVar31 + 1) {
        proto_00 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
                             (&(pDVar30->field_0)._impl_.oneof_decl_.super_RepeatedPtrFieldBase,
                              (int)lVar31);
        full_name_00._M_str = alloc;
        BuildOneof(local_130,proto_00,result_local,
                   (OneofDescriptor *)(&result_local->oneof_decls_->super_SymbolBase + lVar26),alloc
                  );
        lVar26 = lVar26 + 0x38;
      }
      iVar29 = *(int *)((long)&pDVar30->field_0 + 0x10);
      result_local->field_count_ = iVar29;
      pFVar10 = anon_unknown_24::
                FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::AllocateArray<google::protobuf::FieldDescriptor>
                          (&alloc->
                            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                           ,iVar29);
      result_local->fields_ = pFVar10;
      lVar26 = 0;
      for (lVar31 = 0; pDVar30 = local_120, lVar31 < *(int *)((long)&local_120->field_0 + 0x10);
          lVar31 = lVar31 + 1) {
        pVVar9 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                           (&this_01->super_RepeatedPtrFieldBase,(int)lVar31);
        full_name_00._M_str = alloc;
        BuildField(local_130,pVVar9,result_local,
                   (FieldDescriptor *)(&result_local->fields_->super_SymbolBase + lVar26),alloc);
        lVar26 = lVar26 + 0x58;
      }
      iVar29 = *(int *)((long)&local_120->field_0 + 0x40);
      result_local->enum_type_count_ = iVar29;
      pEVar11 = anon_unknown_24::
                FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::AllocateArray<google::protobuf::EnumDescriptor>
                          (&alloc->
                            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                           ,iVar29);
      result_local->enum_types_ = pEVar11;
      lVar26 = 0;
      for (lVar31 = 0; lVar31 < *(int *)((long)&pDVar30->field_0 + 0x40); lVar31 = lVar31 + 1) {
        proto_01 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                             (&(pDVar30->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                              (int)lVar31);
        full_name_00._M_str = alloc;
        BuildEnum(local_130,proto_01,result_local,
                  (EnumDescriptor *)(&result_local->enum_types_->super_SymbolBase + lVar26),alloc);
        lVar26 = lVar26 + 0x58;
      }
      iVar29 = *(int *)((long)&pDVar30->field_0 + 0x58);
      result_local->extension_range_count_ = iVar29;
      pEVar12 = anon_unknown_24::
                FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::AllocateArray<google::protobuf::Descriptor::ExtensionRange>
                          (&alloc->
                            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                           ,iVar29);
      result_local->extension_ranges_ = pEVar12;
      local_f8 = &(pDVar30->field_0)._impl_.extension_range_.super_RepeatedPtrFieldBase;
      lVar26 = 0;
      for (lVar31 = 0; lVar31 < *(int *)((long)&pDVar30->field_0 + 0x58); lVar31 = lVar31 + 1) {
        pVVar13 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                            (local_f8,(int)lVar31);
        full_name_00._M_str = alloc;
        BuildExtensionRange(local_130,pVVar13,result_local,
                            (ExtensionRange *)
                            ((long)&result_local->extension_ranges_->start_ + lVar26),alloc);
        lVar26 = lVar26 + 0x28;
      }
      iVar29 = *(int *)((long)&pDVar30->field_0 + 0x70);
      result_local->extension_count_ = iVar29;
      pFVar10 = anon_unknown_24::
                FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::AllocateArray<google::protobuf::FieldDescriptor>
                          (&alloc->
                            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                           ,iVar29);
      result_local->extensions_ = pFVar10;
      lVar26 = 0;
      for (lVar31 = 0; lVar31 < *(int *)((long)&pDVar30->field_0 + 0x70); lVar31 = lVar31 + 1) {
        pVVar9 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                           (&(pDVar30->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,
                            (int)lVar31);
        full_name_00._M_str = alloc;
        BuildExtension(local_130,pVVar9,result_local,
                       (FieldDescriptor *)(&result_local->extensions_->super_SymbolBase + lVar26),
                       alloc);
        lVar26 = lVar26 + 0x58;
      }
      iVar29 = *(int *)((long)&pDVar30->field_0 + 0xa0);
      result_local->reserved_range_count_ = iVar29;
      pcVar3 = (alloc->
               super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ).pointers_.payload_.super_Base<char>.value;
      if (pcVar3 == (PointerT<char>)0x0) goto LAB_001396b5;
      iVar24 = (alloc->
               super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ).used_.payload_.super_Base<char>.value;
      iVar29 = iVar24 + iVar29 * 8;
      (alloc->
      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ).used_.payload_.super_Base<char>.value = iVar29;
      failure_msg = absl::lts_20250127::log_internal::Check_LEImpl
                              (iVar29,(alloc->
                                      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                                      ).total_.payload_.super_Base<char>.value,
                               "used <= total_.template Get<TypeToUse>()");
      if (failure_msg == (Nullable<const_char_*>)0x0) {
        result_local->reserved_ranges_ = (ReservedRange *)(pcVar3 + iVar24);
        local_118 = &(pDVar30->field_0)._impl_.reserved_range_.super_RepeatedPtrFieldBase;
        lVar26 = 0;
        for (lVar31 = 0; this_03 = local_130, lVar31 < *(int *)((long)&pDVar30->field_0 + 0xa0);
            lVar31 = lVar31 + 1) {
          pVVar14 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                              (local_118,(int)lVar31);
          BuildReservedRange(local_130,pVVar14,result_local,
                             (ReservedRange *)
                             ((long)&result_local->reserved_ranges_->start + lVar26),
                             full_name_00._M_str);
          lVar26 = lVar26 + 8;
        }
        option_name._M_str = "google.protobuf.MessageOptions";
        option_name._M_len = 0x1e;
        AllocateOptions<google::protobuf::Descriptor>
                  (local_130,pDVar30,result_local,7,option_name,alloc);
        iVar29 = this_03->recursion_depth_;
        this_03->recursion_depth_ = iVar29 + -1;
        if (iVar29 < 2) {
          pcVar25 = (result_local->all_names_).payload_;
          element_name._M_len = (ulong)*(ushort *)(pcVar25 + 2);
          element_name._M_str = pcVar25 + ~element_name._M_len;
          AddError(this_03,element_name,&pDVar30->super_Message,OTHER,
                   "Reached maximum recursion limit for nested messages.");
          result_local->nested_types_ = (Descriptor *)0x0;
          result_local->nested_type_count_ = 0;
        }
        else {
          iVar29 = *(int *)((long)&pDVar30->field_0 + 0x28);
          result_local->nested_type_count_ = iVar29;
          pDVar15 = anon_unknown_24::
                    FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                    ::AllocateArray<google::protobuf::Descriptor>
                              (&alloc->
                                super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                               ,iVar29);
          result_local->nested_types_ = pDVar15;
          lVar26 = 0;
          for (lVar31 = 0; lVar31 < *(int *)((long)&pDVar30->field_0 + 0x28); lVar31 = lVar31 + 1) {
            proto_02 = internal::RepeatedPtrFieldBase::
                       Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                                 (&(pDVar30->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase
                                  ,(int)lVar31);
            BuildMessage(local_130,proto_02,result_local,
                         (Descriptor *)(&result_local->nested_types_->super_SymbolBase + lVar26),
                         alloc);
            lVar26 = lVar26 + 0xa0;
          }
          uVar23 = *(uint *)((long)&pDVar30->field_0 + 0xb8);
          result_local->reserved_name_count_ = uVar23;
          ppbVar16 = (anonymous_namespace)::
                     FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                     ::AllocateArray<std::__cxx11::string_const*>
                               ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                                 *)alloc,uVar23);
          result_local->reserved_names_ = ppbVar16;
          this_02 = &(pDVar30->field_0)._impl_.reserved_name_;
          uVar27 = 0;
          uVar28 = (ulong)uVar23;
          if ((int)uVar23 < 1) {
            uVar28 = uVar27;
          }
          for (; uVar28 != uVar27; uVar27 = uVar27 + 1) {
            in = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                           (&this_02->super_RepeatedPtrFieldBase,(int)uVar27);
            psVar17 = (anonymous_namespace)::
                      FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                      ::AllocateStrings<std::__cxx11::string_const&>
                                ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                                  *)alloc,in);
            result_local->reserved_names_[uVar27] = psVar17;
          }
          puVar4 = (ushort *)(result_local->all_names_).payload_;
          full_name._M_len = (ulong)puVar4[1];
          full_name._M_str = (char *)((long)puVar4 + ~full_name._M_len);
          name_00._M_len = (ulong)*puVar4;
          name_00._M_str = (char *)((long)puVar4 + ~name_00._M_len);
          (result_local->super_SymbolBase).symbol_type_ = '\x01';
          AddSymbol(local_130,full_name,parent,name_00,&pDVar30->super_Message,(Symbol)result_local)
          ;
          iVar29 = *(int *)((long)&pDVar30->field_0 + 0xa0);
          iVar24 = 0;
          while (iVar32 = iVar24, iVar32 < iVar29) {
            pVVar14 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                (local_118,iVar32);
            index = iVar32 + 1;
            local_e4 = index;
            for (; iVar29 = *(int *)((long)&pDVar30->field_0 + 0xa0), iVar24 = local_e4,
                index < iVar29; index = index + 1) {
              pVVar18 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                  (local_118,index);
              if (((pVVar18->field_0)._impl_.start_ < (pVVar14->field_0)._impl_.end_) &&
                 ((pVVar14->field_0)._impl_.start_ < (pVVar18->field_0)._impl_.end_)) {
                pcVar25 = (result_local->all_names_).payload_;
                uVar28 = (ulong)*(ushort *)(pcVar25 + 2);
                descriptor = internal::RepeatedPtrFieldBase::
                             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                       (local_118,iVar32);
                make_error.invoker_ =
                     absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
                ;
                make_error.ptr_.obj = &reserved_name_set;
                element_name_00._M_str = pcVar25 + ~uVar28;
                element_name_00._M_len = uVar28;
                reserved_name_set.
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.capacity_ = (size_t)pVVar18;
                reserved_name_set.
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.size_ = (size_t)pVVar14;
                AddError(local_130,element_name_00,&descriptor->super_Message,NUMBER,make_error);
              }
              pDVar30 = local_120;
            }
          }
          reserved_name_set.
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_ = 1;
          reserved_name_set.
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          size_ = 0;
          ppvVar19 = internal::RepeatedPtrFieldBase::elements(&this_02->super_RepeatedPtrFieldBase);
          cVar20 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::end(this_02);
          for (; ppvVar19 != cVar20.it_; ppvVar19 = ppvVar19 + 1) {
            args.slot_ = (slot_type *)*ppvVar19;
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::
            emplace<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                      ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
                        *)&local_110,
                       &reserved_name_set.
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        args.slot_);
            if (local_100 == '\0') {
              make_error_00.invoker_ =
                   absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__1,std::__cxx11::string>
              ;
              make_error_00.ptr_.obj = &local_110;
              element_name_01._M_str = ((_Alloc_hider *)&(args.slot_)->_M_len)->_M_p;
              element_name_01._M_len = (size_t)(args.slot_)->_M_str;
              local_110.slot_ = args.slot_;
              AddError(local_130,element_name_01,&pDVar30->super_Message,NAME,make_error_00);
            }
          }
          this_00 = &local_130->message_hints_;
          iVar29 = 0;
          while (iVar29 < result_local->field_count_) {
            local_120 = (DescriptorProto *)CONCAT44(local_120._4_4_,iVar29);
            field = Descriptor::field(result_local,iVar29);
            for (iVar29 = 0; iVar29 < result_local->extension_range_count_; iVar29 = iVar29 + 1) {
              range = Descriptor::extension_range(result_local,iVar29);
              if ((range->start_ <= field->number_) && (field->number_ < range->end_)) {
                pMVar21 = absl::lts_20250127::container_internal::
                          raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                          ::
                          operator[]<google::protobuf::Descriptor*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>>
                                    ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                                      *)this_00,&result_local);
                pVVar13 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                                    (local_f8,iVar29);
                iVar24 = pMVar21->fields_to_suggest;
                if (iVar24 < 0) {
                  iVar24 = -1;
                }
                uVar23 = iVar24 + 1;
                if (0x1ffffffe < uVar23) {
                  uVar23 = 0x1fffffff;
                }
                pMVar21->fields_to_suggest = uVar23;
                if (pMVar21->first_reason == (Message *)0x0) {
                  pMVar21->first_reason = &pVVar13->super_Message;
                  pMVar21->first_reason_location = NUMBER;
                }
                pcVar25 = (field->all_names_).payload_;
                uVar28 = (ulong)*(ushort *)(pcVar25 + 2);
                pVVar13 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                                    (local_f8,iVar29);
                local_110.slot_ = (slot_type *)&range;
                make_error_01.invoker_ =
                     absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__2,std::__cxx11::string>
                ;
                make_error_01.ptr_.obj = &local_110;
                element_name_02._M_str = pcVar25 + ~uVar28;
                element_name_02._M_len = uVar28;
                local_108.slot_ = (slot_type *)&field;
                AddError(local_130,element_name_02,&pVVar13->super_Message,NUMBER,make_error_01);
              }
            }
            for (iVar29 = 0; iVar29 < result_local->reserved_range_count_; iVar29 = iVar29 + 1) {
              pRVar22 = Descriptor::reserved_range(result_local,iVar29);
              if ((pRVar22->start <= field->number_) && (field->number_ < pRVar22->end)) {
                pMVar21 = absl::lts_20250127::container_internal::
                          raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                          ::
                          operator[]<google::protobuf::Descriptor*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>>
                                    ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                                      *)this_00,&result_local);
                pVVar14 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                    (local_118,iVar29);
                iVar24 = pMVar21->fields_to_suggest;
                if (iVar24 < 0) {
                  iVar24 = -1;
                }
                uVar23 = iVar24 + 1;
                if (0x1ffffffe < uVar23) {
                  uVar23 = 0x1fffffff;
                }
                pMVar21->fields_to_suggest = uVar23;
                if (pMVar21->first_reason == (Message *)0x0) {
                  pMVar21->first_reason = &pVVar14->super_Message;
                  pMVar21->first_reason_location = NUMBER;
                }
                pcVar25 = (field->all_names_).payload_;
                uVar28 = (ulong)*(ushort *)(pcVar25 + 2);
                pVVar14 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                    (local_118,iVar29);
                make_error_02.invoker_ =
                     absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__3,std::__cxx11::string>
                ;
                make_error_02.ptr_.obj = &local_110;
                element_name_03._M_str = pcVar25 + ~uVar28;
                element_name_03._M_len = uVar28;
                local_110.slot_ = (slot_type *)&field;
                AddError(local_130,element_name_03,&pVVar14->super_Message,NUMBER,make_error_02);
              }
            }
            puVar4 = (ushort *)(field->all_names_).payload_;
            local_110._2_6_ = 0;
            local_110._0_2_ = *puVar4;
            local_108.slot_ = (slot_type *)((long)puVar4 + ~(ulong)local_110.slot_);
            bVar5 = absl::lts_20250127::container_internal::
                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    ::contains<std::basic_string_view<char,std::char_traits<char>>>
                              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                                *)&reserved_name_set,
                               (key_arg<std::basic_string_view<char>_> *)&local_110);
            if (bVar5) {
              pcVar25 = (field->all_names_).payload_;
              uVar28 = (ulong)*(ushort *)(pcVar25 + 2);
              pVVar9 = internal::RepeatedPtrFieldBase::
                       Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                                 (&this_01->super_RepeatedPtrFieldBase,(int)local_120);
              make_error_03.invoker_ =
                   absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__4,std::__cxx11::string>
              ;
              make_error_03.ptr_.obj = &local_110;
              element_name_04._M_str = pcVar25 + ~uVar28;
              element_name_04._M_len = uVar28;
              local_110.slot_ = (slot_type *)&field;
              AddError(local_130,element_name_04,&pVVar9->super_Message,NAME,make_error_03);
            }
            iVar29 = (int)local_120 + 1;
          }
          iVar29 = result_local->extension_range_count_;
          iVar24 = 0;
          while (iVar24 < iVar29) {
            field = (FieldDescriptor *)Descriptor::extension_range(result_local,iVar24);
            for (iVar29 = 0; iVar29 < result_local->reserved_range_count_; iVar29 = iVar29 + 1) {
              range = (ExtensionRange *)Descriptor::reserved_range(result_local,iVar29);
              if ((range->start_ < field->number_) &&
                 (iVar32._0_1_ = field->super_SymbolBase, iVar32._1_1_ = field->field_0x1,
                 iVar32._2_1_ = field->type_, iVar32._3_1_ = field->field_0x3, iVar32 < range->end_)
                 ) {
                pcVar25 = (result_local->all_names_).payload_;
                uVar28 = (ulong)*(ushort *)(pcVar25 + 2);
                pVVar13 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                                    (local_f8,iVar24);
                local_108.slot_ = (slot_type *)&range;
                make_error_04.invoker_ =
                     absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__5,std::__cxx11::string>
                ;
                make_error_04.ptr_.obj = &local_110;
                element_name_05._M_str = pcVar25 + ~uVar28;
                element_name_05._M_len = uVar28;
                local_110.slot_ = (slot_type *)&field;
                AddError(local_130,element_name_05,&pVVar13->super_Message,NUMBER,make_error_04);
              }
            }
            iVar32 = iVar24 + 1;
            local_118 = (RepeatedPtrFieldBase *)CONCAT44(local_118._4_4_,iVar32);
            for (; iVar29 = result_local->extension_range_count_, iVar32 < iVar29;
                iVar32 = iVar32 + 1) {
              range = Descriptor::extension_range(result_local,iVar32);
              if ((range->start_ < field->number_) &&
                 (iVar29._0_1_ = field->super_SymbolBase, iVar29._1_1_ = field->field_0x1,
                 iVar29._2_1_ = field->type_, iVar29._3_1_ = field->field_0x3, iVar29 < range->end_)
                 ) {
                pcVar25 = (result_local->all_names_).payload_;
                uVar28 = (ulong)*(ushort *)(pcVar25 + 2);
                pVVar13 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                                    (local_f8,iVar24);
                local_110.slot_ = (slot_type *)&range;
                make_error_05.invoker_ =
                     absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__6,std::__cxx11::string>
                ;
                make_error_05.ptr_.obj = &local_110;
                element_name_06._M_str = pcVar25 + ~uVar28;
                element_name_06._M_len = uVar28;
                local_108.slot_ = (slot_type *)&field;
                AddError(local_130,element_name_06,&pVVar13->super_Message,NUMBER,make_error_05);
              }
            }
            iVar24 = (int)local_118;
          }
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::~raw_hash_set(&reserved_name_set.
                           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         );
        }
        local_130->recursion_depth_ = local_130->recursion_depth_ + 1;
        return;
      }
    }
    iVar29 = 0x1b6;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&reserved_name_set,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
             ,iVar29,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
            ((LogMessageFatal *)&reserved_name_set);
}

Assistant:

void DescriptorBuilder::BuildMessage(const DescriptorProto& proto,
                                     const Descriptor* parent,
                                     Descriptor* result,
                                     internal::FlatAllocator& alloc) {
  const absl::string_view scope =
      (parent == nullptr) ? file_->package() : parent->full_name();
  result->all_names_ = AllocateNameStrings(scope, proto.name(), proto, alloc);
  ValidateSymbolName(proto.name(), result->full_name(), proto);

  result->file_ = file_;
  result->containing_type_ = parent;
  result->is_placeholder_ = false;
  result->is_unqualified_placeholder_ = false;
  result->well_known_type_ = Descriptor::WELLKNOWNTYPE_UNSPECIFIED;
  result->options_ = nullptr;  // Set to default_instance later if necessary.
  result->visibility_ = static_cast<uint8_t>(proto.visibility());

  auto it = pool_->tables_->well_known_types_.find(result->full_name());
  if (it != pool_->tables_->well_known_types_.end()) {
    result->well_known_type_ = it->second;
  }

  // Calculate the continuous sequence of fields.
  // These can be fast-path'd during lookup and don't need to be added to the
  // tables.
  // We use uint16_t to save space for sequential_field_limit_, so stop before
  // overflowing it. Worst case, we are not taking full advantage on huge
  // messages, but it is unlikely.
  result->sequential_field_limit_ = 0;
  for (int i = 0; i < std::numeric_limits<uint16_t>::max() &&
                  i < proto.field_size() && proto.field(i).number() == i + 1;
       ++i) {
    result->sequential_field_limit_ = i + 1;
  }

  // Build oneofs first so that fields and extension ranges can refer to them.
  BUILD_ARRAY(proto, result, oneof_decl, BuildOneof, result);
  BUILD_ARRAY(proto, result, field, BuildField, result);
  BUILD_ARRAY(proto, result, enum_type, BuildEnum, result);
  BUILD_ARRAY(proto, result, extension_range, BuildExtensionRange, result);
  BUILD_ARRAY(proto, result, extension, BuildExtension, result);
  BUILD_ARRAY(proto, result, reserved_range, BuildReservedRange, result);

  // Copy options.
  AllocateOptions(proto, result, DescriptorProto::kOptionsFieldNumber,
                  "google.protobuf.MessageOptions", alloc);

  // Before building submessages, check recursion limit.
  --recursion_depth_;
  IncrementWhenDestroyed revert{recursion_depth_};
  if (recursion_depth_ <= 0) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "Reached maximum recursion limit for nested messages.");
    result->nested_types_ = nullptr;
    result->nested_type_count_ = 0;
    return;
  }
  BUILD_ARRAY(proto, result, nested_type, BuildMessage, result);

  // Copy reserved names.
  int reserved_name_count = proto.reserved_name_size();
  result->reserved_name_count_ = reserved_name_count;
  result->reserved_names_ =
      alloc.AllocateArray<const std::string*>(reserved_name_count);
  for (int i = 0; i < reserved_name_count; ++i) {
    result->reserved_names_[i] = alloc.AllocateStrings(proto.reserved_name(i));
  }

  AddSymbol(result->full_name(), parent, result->name(), proto, Symbol(result));

  for (int i = 0; i < proto.reserved_range_size(); i++) {
    const DescriptorProto_ReservedRange& range1 = proto.reserved_range(i);
    for (int j = i + 1; j < proto.reserved_range_size(); j++) {
      const DescriptorProto_ReservedRange& range2 = proto.reserved_range(j);
      if (range1.end() > range2.start() && range2.end() > range1.start()) {
        AddError(result->full_name(), proto.reserved_range(i),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Reserved range $0 to $1 overlaps with "
                       "already-defined range $2 to $3.",
                       range2.start(), range2.end() - 1, range1.start(),
                       range1.end() - 1);
                 });
      }
    }
  }

  absl::flat_hash_set<absl::string_view> reserved_name_set;
  for (const std::string& name : proto.reserved_name()) {
    if (!reserved_name_set.insert(name).second) {
      AddError(name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
        return absl::Substitute("Field name \"$0\" is reserved multiple times.",
                                name);
      });
    }
  }
  // Check that fields aren't using reserved names or numbers and that they
  // aren't using extension numbers.
  for (int i = 0; i < result->field_count(); i++) {
    const FieldDescriptor* field = result->field(i);
    for (int j = 0; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range = result->extension_range(j);
      if (range->start_number() <= field->number() &&
          field->number() < range->end_number()) {
        message_hints_[result].RequestHintOnFieldNumbers(
            proto.extension_range(j), DescriptorPool::ErrorCollector::NUMBER);
        AddError(field->full_name(), proto.extension_range(j),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Extension range $0 to $1 includes field \"$2\" ($3).",
                       range->start_number(), range->end_number() - 1,
                       field->name(), field->number());
                 });
      }
    }
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const Descriptor::ReservedRange* range = result->reserved_range(j);
      if (range->start <= field->number() && field->number() < range->end) {
        message_hints_[result].RequestHintOnFieldNumbers(
            proto.reserved_range(j), DescriptorPool::ErrorCollector::NUMBER);
        AddError(field->full_name(), proto.reserved_range(j),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Field \"$0\" uses reserved number $1.", field->name(),
                       field->number());
                 });
      }
    }
    if (reserved_name_set.contains(field->name())) {
      AddError(field->full_name(), proto.field(i),
               DescriptorPool::ErrorCollector::NAME, [&] {
                 return absl::Substitute("Field name \"$0\" is reserved.",
                                         field->name());
               });
    }
  }

  // Check that extension ranges don't overlap and don't include
  // reserved field numbers or names.
  for (int i = 0; i < result->extension_range_count(); i++) {
    const Descriptor::ExtensionRange* range1 = result->extension_range(i);
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const Descriptor::ReservedRange* range2 = result->reserved_range(j);
      if (range1->end_number() > range2->start &&
          range2->end > range1->start_number()) {
        AddError(result->full_name(), proto.extension_range(i),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Extension range $0 to $1 overlaps with "
                       "reserved range $2 to $3.",
                       range1->start_number(), range1->end_number() - 1,
                       range2->start, range2->end - 1);
                 });
      }
    }
    for (int j = i + 1; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range2 = result->extension_range(j);
      if (range1->end_number() > range2->start_number() &&
          range2->end_number() > range1->start_number()) {
        AddError(result->full_name(), proto.extension_range(i),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Extension range $0 to $1 overlaps with "
                       "already-defined range $2 to $3.",
                       range2->start_number(), range2->end_number() - 1,
                       range1->start_number(), range1->end_number() - 1);
                 });
      }
    }
  }
}